

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool crnd::crnd_create_segmented_file
               (void *pData,uint32 data_size,void *pBase_data,uint base_data_size)

{
  uint16 uVar1;
  uint uVar2;
  uint32 val;
  uint uVar3;
  uint uVar4;
  crn_header *pcVar5;
  crn_header *new_header;
  uint actual_base_data_size;
  crn_header *pHeader;
  uint base_data_size_local;
  void *pBase_data_local;
  uint32 data_size_local;
  void *pData_local;
  
  if ((pData == (void *)0x0) || (data_size < 0x3e)) {
    pData_local._7_1_ = false;
  }
  else {
    pcVar5 = crnd_get_header(pData,data_size);
    if (pcVar5 == (crn_header *)0x0) {
      pData_local._7_1_ = false;
    }
    else {
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar5->m_flags);
      if ((uVar2 & 1) == 0) {
        val = crnd_get_segmented_file_size(pData,data_size);
        if (base_data_size < val) {
          pData_local._7_1_ = false;
        }
        else {
          memcpy(pBase_data,pData,(ulong)val);
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)pBase_data + 0x13));
          crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)pBase_data + 0x13),uVar2 | 1)
          ;
          crn_packed_uint<4U>::operator=((crn_packed_uint<4U> *)((long)pBase_data + 6),val);
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)pBase_data + 2));
          uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)pBase_data + 6));
          uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)pBase_data + 2));
          uVar1 = crc16((void *)((long)pBase_data + (ulong)uVar2),uVar3 - uVar4,0);
          crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)pBase_data + 10),(uint)uVar1)
          ;
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)((long)pBase_data + 2));
          uVar1 = crc16((void *)((long)pBase_data + 6),uVar2 - 6,0);
          crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)pBase_data + 4),(uint)uVar1);
          pData_local._7_1_ = true;
        }
      }
      else {
        pData_local._7_1_ = false;
      }
    }
  }
  return pData_local._7_1_;
}

Assistant:

bool crnd_create_segmented_file(const void* pData, uint32 data_size, void* pBase_data, uint base_data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        if (pHeader->m_flags & cCRNHeaderFlagSegmented)
            return false;

        const uint actual_base_data_size = crnd_get_segmented_file_size(pData, data_size);
        if (base_data_size < actual_base_data_size)
            return false;

        memcpy(pBase_data, pData, actual_base_data_size);

        crn_header& new_header = *static_cast<crn_header*>(pBase_data);
        new_header.m_flags = new_header.m_flags | cCRNHeaderFlagSegmented;
        new_header.m_data_size = actual_base_data_size;

        new_header.m_data_crc16 = crc16((const uint8*)pBase_data + new_header.m_header_size, new_header.m_data_size - new_header.m_header_size);

        new_header.m_header_crc16 = crc16(&new_header.m_data_size, new_header.m_header_size - (uint32)((const uint8*)&new_header.m_data_size - (const uint8*)&new_header));

        CRND_ASSERT(crnd_validate_file(&new_header, actual_base_data_size, NULL));

        return true;
    }